

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scan.cpp
# Opt level: O1

void test_exclusive_scan<int,std::multiplies<int>>(uint W)

{
  int iVar1;
  code *pcVar2;
  double dVar3;
  pointer puVar4;
  pointer puVar5;
  char extraout_AL;
  bool bVar6;
  char extraout_AL_00;
  int iVar7;
  int iVar8;
  int *piVar9;
  pointer *__ptr;
  default_delete<tf::Node> *this;
  size_type sVar10;
  int *piVar11;
  Executor *this_00;
  ulong __n;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar13;
  int local_380;
  in_place_type_t<tf::Node::Subflow> local_37a;
  DefaultTaskParams local_379;
  Expression_lhs<const_std::vector<int,_std::allocator<int>_>_&> local_378;
  Task alloc;
  Result local_360;
  Task task2;
  ResultBuilder DOCTEST_RB;
  vector<int,_std::allocator<int>_> input;
  vector<int,_std::allocator<int>_> golden;
  vector<int,_std::allocator<int>_> output;
  Task task1;
  iterator dbeg;
  iterator send;
  iterator sbeg;
  shared_ptr<tf::WorkerInterface> local_248;
  Taskflow taskflow;
  Executor executor;
  
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_248);
  if (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  taskflow.super_FlowBuilder._graph = &taskflow._graph;
  taskflow._mutex.super___mutex_base._M_mutex.__align = 0;
  taskflow._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  taskflow._name._M_dataplus._M_p = (pointer)&taskflow._name.field_2;
  taskflow._name._M_string_length = 0;
  taskflow._name.field_2._M_local_buf[0] = '\0';
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&taskflow._topologies,0);
  taskflow._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload
  .super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  __n = 0;
  while( true ) {
    puVar5 = taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar4 = taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this = (default_delete<tf::Node> *)
           taskflow._graph.
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           .
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    if (taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (*(Node **)this != (Node *)0x0) {
          std::default_delete<tf::Node>::operator()(this,*(Node **)this);
        }
        *(undefined8 *)this = 0;
        this = this + 8;
      } while (this != (default_delete<tf::Node> *)puVar5);
      taskflow._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar4;
    }
    std::vector<int,_std::allocator<int>_>::vector(&input,__n,(allocator_type *)&DOCTEST_RB);
    std::vector<int,_std::allocator<int>_>::vector(&output,__n,(allocator_type *)&DOCTEST_RB);
    std::vector<int,_std::allocator<int>_>::vector(&golden,__n,(allocator_type *)&DOCTEST_RB);
    sbeg._M_current = (int *)0x0;
    send._M_current = (int *)0x0;
    dbeg._M_current = (int *)0x0;
    if (__n != 0) {
      sVar10 = 0;
      do {
        iVar7 = rand();
        input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [sVar10] = iVar7 % 10;
        sVar10 = sVar10 + 1;
      } while (__n != sVar10);
    }
    iVar8 = rand();
    iVar8 = iVar8 % 10;
    iVar7 = iVar8;
    piVar9 = golden.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    for (piVar11 = input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        piVar11 !=
        input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish; piVar11 = piVar11 + 1) {
      iVar1 = *piVar11;
      *piVar9 = iVar7;
      piVar9 = piVar9 + 1;
      iVar7 = iVar1 * iVar7;
    }
    DOCTEST_RB.super_AssertData.m_test_case =
         (TestCaseData *)
         input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    DOCTEST_RB.super_AssertData._8_8_ =
         input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    DOCTEST_RB.super_AssertData.m_file =
         (char *)output.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
    DOCTEST_RB.super_AssertData.m_line = iVar8;
    local_360.m_passed = false;
    local_360._1_7_ = 0;
    local_378.lhs = (vector<int,_std::allocator<int>_> *)0x0;
    alloc._node = alloc._node & 0xffffffff00000000;
    task1._node = tf::Graph::
                  _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Subflow>,tf::make_exclusive_scan_task<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int,std::multiplies<int>>(__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int,std::multiplies<int>)::_lambda(tf::Subflow&)_1_>
                            (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                             (DefaultTaskParams *)&task2,(void **)&local_360,&local_378.lhs,
                             (int *)&alloc,(in_place_type_t<tf::Node::Subflow> *)&local_380,
                             (anon_class_32_5_19846b26 *)&DOCTEST_RB);
    local_360.m_passed = false;
    local_360._1_7_ = 0;
    local_378.lhs = (vector<int,_std::allocator<int>_> *)0x0;
    task2._node = task2._node & 0xffffffff00000000;
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&sbeg;
    DOCTEST_RB.super_AssertData._8_8_ = &input;
    DOCTEST_RB.super_AssertData.m_file = (char *)&send;
    DOCTEST_RB.super_AssertData._24_8_ = &dbeg;
    alloc._node = tf::Graph::
                  _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Static>,test_exclusive_scan<int,std::multiplies<int>>(unsigned_int)::_lambda()_1_>
                            (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                             (DefaultTaskParams *)&local_380,(void **)&local_360,&local_378.lhs,
                             (int *)&task2,(in_place_type_t<tf::Node::Static> *)&local_379,
                             (anon_class_32_4_6a670194 *)&DOCTEST_RB);
    local_360.m_passed = false;
    local_360._1_7_ = 0;
    local_378.lhs = (vector<int,_std::allocator<int>_> *)0x0;
    local_380 = 0;
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&sbeg;
    DOCTEST_RB.super_AssertData._8_8_ = &send;
    DOCTEST_RB.super_AssertData.m_file = (char *)&dbeg;
    task2._node = tf::Graph::
                  _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Subflow>,tf::make_exclusive_scan_task<std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,int,std::multiplies<int>>(std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,int,std::multiplies<int>)::_lambda(tf::Subflow&)_1_>
                            (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                             &local_379,(void **)&local_360,&local_378.lhs,&local_380,&local_37a,
                             (anon_class_32_5_19846b26_conflict *)&DOCTEST_RB);
    tf::Task::precede<tf::Task&>(&task1,&alloc);
    tf::Task::precede<tf::Task&>(&alloc,&task2);
    local_360.m_passed = true;
    local_360._1_7_ = 0;
    this_00 = &executor;
    tf::Executor::
    run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
              ((Future<void> *)&DOCTEST_RB,this_00,&taskflow,(anon_class_8_1_69701ed9 *)&local_360,
               (anon_class_1_0_00000001 *)&local_378);
    if (DOCTEST_RB.super_AssertData.m_test_case == (TestCaseData *)0x0) break;
    std::__future_base::_State_baseV2::wait
              ((_State_baseV2 *)DOCTEST_RB.super_AssertData.m_test_case,this_00);
    if (DOCTEST_RB.super_AssertData._24_8_ != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar11 = (int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
        iVar7 = *piVar11;
        *piVar11 = *piVar11 + -1;
        UNLOCK();
      }
      else {
        iVar7 = *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
        *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc) = iVar7 + -1;
      }
      if (iVar7 == 1) {
        (**(code **)(*(long *)DOCTEST_RB.super_AssertData._24_8_ + 0x18))();
      }
    }
    if (DOCTEST_RB.super_AssertData._8_8_ != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)DOCTEST_RB.super_AssertData._8_8_);
    }
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_scan.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x142;
    DOCTEST_RB.super_AssertData.m_expr = "input == golden";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_378.lhs = &input;
    local_378.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<const_std::vector<int,_std::allocator<int>_>_&>::
    operator==<std::vector<int,_std::allocator<int>_>,_nullptr>(&local_360,&local_378,&golden);
    doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_360.m_decomp);
    DOCTEST_RB.super_AssertData._40_2_ =
         CONCAT11(DOCTEST_RB.super_AssertData.m_threw,local_360.m_passed) ^ 1;
    uVar12 = extraout_XMM0_Da;
    uVar13 = extraout_XMM0_Db;
    if ((local_360.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_360.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_360.m_decomp.field_0.data.ptr);
      uVar12 = extraout_XMM0_Da_00;
      uVar13 = extraout_XMM0_Db_00;
    }
    dVar3 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar13,uVar12));
    if (extraout_AL != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)(SUB84(dVar3,0));
      return;
    }
    if (DOCTEST_RB.super_AssertData.m_failed == true) {
      bVar6 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
      if (bVar6) goto LAB_001356c2;
    }
    if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                         DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                         DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]));
    }
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_scan.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x143;
    DOCTEST_RB.super_AssertData.m_expr = "output == golden";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_378.lhs = &output;
    local_378.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<const_std::vector<int,_std::allocator<int>_>_&>::
    operator==<std::vector<int,_std::allocator<int>_>,_nullptr>(&local_360,&local_378,&golden);
    doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_360.m_decomp);
    DOCTEST_RB.super_AssertData._40_2_ =
         CONCAT11(DOCTEST_RB.super_AssertData.m_threw,local_360.m_passed) ^ 1;
    uVar12 = extraout_XMM0_Da_01;
    uVar13 = extraout_XMM0_Db_01;
    if ((local_360.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_360.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_360.m_decomp.field_0.data.ptr);
      uVar12 = extraout_XMM0_Da_02;
      uVar13 = extraout_XMM0_Db_02;
    }
    dVar3 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar13,uVar12));
    if (extraout_AL_00 != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)(SUB84(dVar3,0));
      return;
    }
    if (DOCTEST_RB.super_AssertData.m_failed == true) {
      bVar6 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
      if (bVar6) {
        doctest::detail::throwException();
      }
    }
    if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                         DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                         DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]));
    }
    if (golden.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(golden.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)golden.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)golden.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (output.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(output.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)output.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)output.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        != (pointer)0x0) {
      operator_delete(input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    __n = __n * 2 + 1;
    if (250000 < __n) {
      tf::Taskflow::~Taskflow(&taskflow);
      tf::Executor::~Executor(&executor);
      return;
    }
  }
  std::__throw_future_error(3);
LAB_001356c2:
  doctest::detail::throwException();
}

Assistant:

void test_exclusive_scan(unsigned W) {
  
  tf::Executor executor(W);
  tf::Taskflow taskflow;

  size_t limit = std::is_same_v<T, std::string> ? 2500 : 250000;
  
  for(size_t n=0; n<=limit; n=n*2+1) {

    taskflow.clear();
    
    std::vector<T> input(n), output(n), golden(n); 
    typename std::vector<T>::iterator sbeg, send, dbeg;

    for(size_t i=0; i<n; i++) {
      if constexpr(std::is_same_v<T, std::string>) {
        input[i] = std::to_string(::rand() % 10);
      }
      else {
        input[i] = ::rand() % 10;
      }
    }
    
    T init;
    if constexpr(std::is_same_v<T, std::string>) {
      init = std::to_string(::rand() % 10);
    }
    else {
      init = ::rand() % 10;
    }

    std::exclusive_scan(
      input.begin(), input.end(), golden.begin(), init, B()
    );
    
    // out-of-place
    auto task1 = taskflow.exclusive_scan(
      input.begin(), input.end(), output.begin(), init, B()
    );  
    
    // enable stateful capture
    auto alloc = taskflow.emplace([&](){
      sbeg = input.begin();
      send = input.end();
      dbeg = input.begin();
    });
    
    // in-place
    auto task2 = taskflow.exclusive_scan(
      std::ref(sbeg), std::ref(send), std::ref(dbeg), init, B()
    );

    task1.precede(alloc);
    alloc.precede(task2);

    executor.run(taskflow).wait();

    REQUIRE(input == golden);
    REQUIRE(output == golden);
  }
}